

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gain_calculator_direct_speakers.cpp
# Opt level: O0

optional<int> __thiscall
ear::GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds
          (GainCalculatorDirectSpeakersImpl *this,SpeakerPosition *position,bool isLfe,double tol)

{
  size_type sVar1;
  reference pvVar2;
  iterator iVar3;
  iterator iVar4;
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *this_00;
  double extraout_XMM0_Qa;
  undefined1 local_48 [8];
  vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> candidates;
  double tol_local;
  bool isLfe_local;
  SpeakerPosition *position_local;
  GainCalculatorDirectSpeakersImpl *this_local;
  
  candidates.super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)tol;
  _findCandidates((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                  local_48,this,position,isLfe,tol);
  sVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                    ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                     local_48);
  if (sVar1 == 0) {
    boost::optional<int>::optional((optional<int> *)&this_local);
  }
  else {
    sVar1 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::size
                      ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)
                       local_48);
    if (sVar1 == 1) {
      pvVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
               operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                           *)local_48,0);
      boost::optional<int>::optional((optional<int> *)&this_local,&pvVar2->first);
    }
    else {
      iVar3 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::begin
                        ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                         )local_48);
      iVar4 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::end
                        ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *
                         )local_48);
      std::
      sort<__gnu_cxx::__normal_iterator<std::pair<int,double>*,std::vector<std::pair<int,double>,std::allocator<std::pair<int,double>>>>,ear::GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds(boost::variant<ear::PolarSpeakerPosition,ear::CartesianSpeakerPosition>const&,bool,double)::__0>
                (iVar3._M_current,iVar4._M_current);
      this_00 = (vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_48
      ;
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (this_00,0);
      std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::operator[]
                (this_00,1);
      std::abs((int)this_00);
      if (extraout_XMM0_Qa <=
          (double)candidates.
                  super__Vector_base<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage) {
        boost::optional<int>::optional((optional<int> *)&this_local);
      }
      else {
        pvVar2 = std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::
                 operator[]((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>
                             *)local_48,0);
        boost::optional<int>::optional((optional<int> *)&this_local,&pvVar2->first);
      }
    }
  }
  std::vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_>::~vector
            ((vector<std::pair<int,_double>,_std::allocator<std::pair<int,_double>_>_> *)local_48);
  return (optional<int>)(type)this_local;
}

Assistant:

boost::optional<int>
  GainCalculatorDirectSpeakersImpl::_findChannelWithinBounds(
      const SpeakerPosition& position, bool isLfe, double tol) {
    std::vector<std::pair<int, double>> candidates =
        _findCandidates(position, isLfe, tol);
    if (candidates.size() == 0) {
      return boost::none;
    } else if (candidates.size() == 1) {
      return candidates[0].first;
    } else {
      std::sort(candidates.begin(), candidates.end(),
                [](const std::pair<int, double>& a,
                   const std::pair<int, double>& b) -> bool {
                  return a.second < b.second;
                });
      if (std::abs(candidates[0].second - candidates[1].second) > tol) {
        return candidates[0].first;
      }
    }
    return boost::none;
  }